

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

CharacterCounts __thiscall
ON_XMLNode::WriteChildrenToStream
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat,bool sortedProperties)

{
  ON_XMLNode *pOVar1;
  int iVar2;
  uint extraout_var;
  int iVar3;
  int iVar4;
  CharacterCounts CVar5;
  ChildIterator it;
  ChildIterator local_40;
  
  (*this->_vptr_ON_XMLNode[0x2c])(&local_40,this);
  iVar3 = 0;
  iVar4 = 0;
  while( true ) {
    pOVar1 = (local_40._private)->_current;
    if (pOVar1 == (ON_XMLNode *)0x0) break;
    (local_40._private)->_current = pOVar1->_private->m_next_sibling;
    iVar2 = (*pOVar1->_vptr_ON_XMLNode[0x1c])
                      (pOVar1,stream,(ulong)max_chars,(ulong)includeFormatting,forceLongFormat,
                       sortedProperties);
    if (stream != (wchar_t *)0x0) {
      stream = stream + extraout_var;
    }
    max_chars = max_chars - iVar2;
    if ((int)max_chars < 1) {
      max_chars = 0;
    }
    iVar4 = iVar4 + iVar2;
    iVar3 = iVar3 + extraout_var;
  }
  ChildIterator::~ChildIterator(&local_40);
  CVar5._physical = iVar3;
  CVar5._logical = iVar4;
  CVar5._reserved = 0;
  return CVar5;
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteChildrenToStream(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat, bool sortedProperties) const
{
  CharacterCounts counts;

  ON_XMLNode* pChild = nullptr;
  auto it = GetChildIterator();
  while (nullptr != (pChild = it.GetNextChild()))
  {
    const auto cc = pChild->WriteToStreamEx(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
    counts += cc;
    if (nullptr != stream)
      stream += cc._physical;
    max_chars = std::max(0, int(max_chars - cc._logical));
  }

  return counts;
}